

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

void add_struct_str_member_fn(File *fp,char **dest,char *str)

{
  uint uVar1;
  char *pcVar2;
  char *str_local;
  char **dest_local;
  File *fp_local;
  
  if (fp->binary == 0) {
    if (fp->first_member == 0) {
      myfprintf(fp->fp,", ");
    }
    myfprintf(fp->fp,"\"%s\"",str);
  }
  else {
    pcVar2 = (char *)make_string(fp,str);
    *dest = pcVar2;
    if ((fp->str_relocations).v == (char **)0x0) {
      pcVar2 = (fp->tables).start;
      (fp->str_relocations).v = (fp->str_relocations).e;
      uVar1 = (fp->str_relocations).n;
      (fp->str_relocations).n = uVar1 + 1;
      (fp->str_relocations).e[uVar1] = (char *)((long)dest - (long)pcVar2);
    }
    else {
      if ((fp->str_relocations).v == (fp->str_relocations).e) {
        if ((fp->str_relocations).n < 3) {
          uVar1 = (fp->str_relocations).n;
          (fp->str_relocations).n = uVar1 + 1;
          (fp->str_relocations).v[uVar1] = (char *)((long)dest - (long)(fp->tables).start);
          goto LAB_0013c796;
        }
      }
      else if (((fp->str_relocations).n & 7) != 0) {
        uVar1 = (fp->str_relocations).n;
        (fp->str_relocations).n = uVar1 + 1;
        (fp->str_relocations).v[uVar1] = (char *)((long)dest - (long)(fp->tables).start);
        goto LAB_0013c796;
      }
      vec_add_internal(&fp->str_relocations,(void *)((long)dest - (long)(fp->tables).start));
    }
  }
LAB_0013c796:
  fp->first_member = 0;
  return;
}

Assistant:

static void add_struct_str_member_fn(File *fp, char **dest, const char *str) {
  if (fp->binary) {
    *dest = (char *)make_string(fp, str);
    vec_add(&fp->str_relocations, (void *)((char *)dest - fp->tables.start));
  } else {
    if (!fp->first_member) fprintf(fp->fp, ", ");
    fprintf(fp->fp, "\"%s\"", str);
  }
  fp->first_member = 0;
}